

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void init_config_sequence(AV1_PRIMARY *ppi,AV1EncoderConfig *oxcf)

{
  long in_RSI;
  long in_RDI;
  ColorCfg *color_cfg;
  DecoderModelCfg *dec_model_cfg;
  SequenceHeader *seq_params;
  AV1EncoderConfig *in_stack_00000028;
  AV1_PRIMARY *in_stack_00000030;
  
  *(undefined4 *)(in_RDI + 0xc750) = 0;
  *(undefined4 *)(in_RDI + 0xc75c) = 1;
  *(undefined4 *)(in_RDI + 0xc758) = 1;
  *(undefined1 *)(in_RDI + 0xbffd) = *(undefined1 *)(in_RSI + 0x434);
  *(undefined4 *)(in_RDI + 0xc000) = *(undefined4 *)(in_RSI + 0x110);
  *(byte *)(in_RDI + 0xc004) = *(byte *)(in_RSI + 0x453) & 1;
  *(undefined4 *)(in_RDI + 0xc008) = *(undefined4 *)(in_RSI + 0x388);
  *(undefined4 *)(in_RDI + 0xc00c) = *(undefined4 *)(in_RSI + 0x38c);
  *(undefined4 *)(in_RDI + 0xc010) = *(undefined4 *)(in_RSI + 0x390);
  *(byte *)(in_RDI + 0xc005) = *(byte *)(in_RSI + 0x124) & 1;
  *(undefined4 *)(in_RDI + 0xc020) = *(undefined4 *)(in_RSI + 0x394);
  *(undefined4 *)(in_RDI + 0xc014) = *(undefined4 *)(in_RSI + 0x398);
  *(uint *)(in_RDI + 0xc0b0) = (uint)(*(byte *)(in_RSI + 0x3b2) & 1);
  *(undefined4 *)(in_RDI + 0xc0b4) = *(undefined4 *)(in_RSI + 0x39c);
  *(undefined4 *)(in_RDI + 0xc0b8) = *(undefined4 *)(in_RSI + 0x3a0);
  *(undefined4 *)(in_RDI + 0xc0bc) = *(undefined4 *)(in_RSI + 0x3a4);
  *(undefined4 *)(in_RDI + 0xc0c0) = *(undefined4 *)(in_RSI + 0x3a8);
  *(byte *)(in_RDI + 0xc0d8) = *(byte *)(in_RSI + 0x3b1) & 1;
  *(byte *)(in_RDI + 0xc0c4) = *(byte *)(in_RSI + 0x3b0) & 1;
  if ((*(byte *)(in_RSI + 0x3b0) & 1) == 0) {
    if (((*(int *)(in_RDI + 0xc0b0) == 0) || (*(int *)(in_RDI + 0xc0bc) == 0)) ||
       (*(char *)(in_RDI + 0xc0c4) != '\0')) {
      *(undefined4 *)(in_RDI + 0xc148) = 10;
    }
    else {
      av1_set_resource_availability_parameters((aom_dec_model_op_parameters_t *)(in_RDI + 0xc120));
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0xc0c8) = *(undefined4 *)(in_RSI + 0x3ac);
    *(undefined1 *)(in_RDI + 0xc754) = 1;
    av1_set_aom_dec_model_info((aom_dec_model_info_t *)(in_RDI + 0xc0c8));
    av1_set_dec_model_op_parameters((aom_dec_model_op_parameters_t *)(in_RDI + 0xc120));
  }
  if (*(char *)(in_RDI + 0xc005) == '\0') {
    if (((*(int *)(in_RDI + 0xc008) == 1) && (*(int *)(in_RDI + 0xc00c) == 0xd)) &&
       (*(int *)(in_RDI + 0xc010) == 0)) {
      *(undefined4 *)(in_RDI + 0xc018) = 0;
      *(undefined4 *)(in_RDI + 0xc01c) = 0;
    }
    else if (*(char *)(in_RDI + 0xbffd) == '\0') {
      *(undefined4 *)(in_RDI + 0xc018) = 1;
      *(undefined4 *)(in_RDI + 0xc01c) = 1;
    }
    else if (*(char *)(in_RDI + 0xbffd) == '\x01') {
      *(undefined4 *)(in_RDI + 0xc018) = 0;
      *(undefined4 *)(in_RDI + 0xc01c) = 0;
    }
    else if (*(int *)(in_RDI + 0xc000) == 0xc) {
      *(undefined4 *)(in_RDI + 0xc018) = *(undefined4 *)(in_RSI + 0x10);
      *(undefined4 *)(in_RDI + 0xc01c) = *(undefined4 *)(in_RSI + 0x14);
    }
    else {
      *(undefined4 *)(in_RDI + 0xc018) = 1;
      *(undefined4 *)(in_RDI + 0xc01c) = 0;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0xc018) = 1;
    *(undefined4 *)(in_RDI + 0xc01c) = 1;
  }
  av1_change_config_seq(in_stack_00000030,in_stack_00000028,(_Bool *)ppi);
  return;
}

Assistant:

static void init_config_sequence(struct AV1_PRIMARY *ppi,
                                 const AV1EncoderConfig *oxcf) {
  SequenceHeader *const seq_params = &ppi->seq_params;
  const DecoderModelCfg *const dec_model_cfg = &oxcf->dec_model_cfg;
  const ColorCfg *const color_cfg = &oxcf->color_cfg;

  ppi->use_svc = 0;
  ppi->number_spatial_layers = 1;
  ppi->number_temporal_layers = 1;

  seq_params->profile = oxcf->profile;
  seq_params->bit_depth = oxcf->tool_cfg.bit_depth;
  seq_params->use_highbitdepth = oxcf->use_highbitdepth;
  seq_params->color_primaries = color_cfg->color_primaries;
  seq_params->transfer_characteristics = color_cfg->transfer_characteristics;
  seq_params->matrix_coefficients = color_cfg->matrix_coefficients;
  seq_params->monochrome = oxcf->tool_cfg.enable_monochrome;
  seq_params->chroma_sample_position = color_cfg->chroma_sample_position;
  seq_params->color_range = color_cfg->color_range;
  seq_params->timing_info_present = dec_model_cfg->timing_info_present;
  seq_params->timing_info.num_units_in_display_tick =
      dec_model_cfg->timing_info.num_units_in_display_tick;
  seq_params->timing_info.time_scale = dec_model_cfg->timing_info.time_scale;
  seq_params->timing_info.equal_picture_interval =
      dec_model_cfg->timing_info.equal_picture_interval;
  seq_params->timing_info.num_ticks_per_picture =
      dec_model_cfg->timing_info.num_ticks_per_picture;

  seq_params->display_model_info_present_flag =
      dec_model_cfg->display_model_info_present_flag;
  seq_params->decoder_model_info_present_flag =
      dec_model_cfg->decoder_model_info_present_flag;
  if (dec_model_cfg->decoder_model_info_present_flag) {
    // set the decoder model parameters in schedule mode
    seq_params->decoder_model_info.num_units_in_decoding_tick =
        dec_model_cfg->num_units_in_decoding_tick;
    ppi->buffer_removal_time_present = 1;
    av1_set_aom_dec_model_info(&seq_params->decoder_model_info);
    av1_set_dec_model_op_parameters(&seq_params->op_params[0]);
  } else if (seq_params->timing_info_present &&
             seq_params->timing_info.equal_picture_interval &&
             !seq_params->decoder_model_info_present_flag) {
    // set the decoder model parameters in resource availability mode
    av1_set_resource_availability_parameters(&seq_params->op_params[0]);
  } else {
    seq_params->op_params[0].initial_display_delay =
        10;  // Default value (not signaled)
  }

  if (seq_params->monochrome) {
    seq_params->subsampling_x = 1;
    seq_params->subsampling_y = 1;
  } else if (seq_params->color_primaries == AOM_CICP_CP_BT_709 &&
             seq_params->transfer_characteristics == AOM_CICP_TC_SRGB &&
             seq_params->matrix_coefficients == AOM_CICP_MC_IDENTITY) {
    seq_params->subsampling_x = 0;
    seq_params->subsampling_y = 0;
  } else {
    if (seq_params->profile == 0) {
      seq_params->subsampling_x = 1;
      seq_params->subsampling_y = 1;
    } else if (seq_params->profile == 1) {
      seq_params->subsampling_x = 0;
      seq_params->subsampling_y = 0;
    } else {
      if (seq_params->bit_depth == AOM_BITS_12) {
        seq_params->subsampling_x = oxcf->input_cfg.chroma_subsampling_x;
        seq_params->subsampling_y = oxcf->input_cfg.chroma_subsampling_y;
      } else {
        seq_params->subsampling_x = 1;
        seq_params->subsampling_y = 0;
      }
    }
  }
  av1_change_config_seq(ppi, oxcf, NULL);
}